

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O0

void Omega_h::inertia::recursively_bisect
               (CommPtr *comm,Real tolerance,Reals *p_coords,Reals *p_masses,Remotes *p_owners,
               Rib *p_hints)

{
  double dVar1;
  double dVar2;
  Vector<3> axis_00;
  bool bVar3;
  I32 IVar4;
  int key;
  element_type *peVar5;
  reference pvVar6;
  element_type *peVar7;
  __normal_iterator<Omega_h::Vector<3>_*,_std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>_>
  local_2c0;
  const_iterator local_2b8;
  shared_ptr<Omega_h::Comm> local_2b0;
  undefined1 local_2a0 [28];
  int halfsize;
  Remotes local_268;
  Read<double> local_248;
  undefined1 local_238 [48];
  Read<signed_char> local_208;
  shared_ptr<Omega_h::Comm> local_1f8;
  undefined1 local_1e8 [8];
  Dist dist;
  Read<double> local_140;
  Read<double> local_130;
  shared_ptr<Omega_h::Comm> local_120;
  CommPtr local_110;
  Vector<3> *local_100;
  __normal_iterator<Omega_h::Vector<3>_*,_std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>_>
  local_f8;
  const_iterator local_f0;
  Read<double> local_e8 [2];
  Read<double> local_c8;
  shared_ptr<Omega_h::Comm> local_b8;
  Read<signed_char> local_a8;
  undefined1 local_98 [8];
  Read<signed_char> marks;
  Vector<3> axis;
  Rib *hints;
  Remotes *owners;
  Reals *masses;
  Reals *coords;
  Rib *p_hints_local;
  Remotes *p_owners_local;
  Reals *p_masses_local;
  Reals *p_coords_local;
  Real tolerance_local;
  CommPtr *comm_local;
  
  peVar5 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)comm);
  IVar4 = Comm::size(peVar5);
  if (IVar4 != 1) {
    local_98 = (undefined1  [8])0x0;
    marks.write_.shared_alloc_.alloc = (Alloc *)0x0;
    bVar3 = std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::empty
                      (&p_hints->axes);
    if (bVar3) {
      std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_b8,comm);
      Read<double>::Read(&local_c8,p_coords);
      Read<double>::Read(local_e8,p_masses);
      mark_bisection((inertia *)&local_a8,&local_b8,&local_c8,local_e8,tolerance,
                     (Vector<3> *)&marks.write_.shared_alloc_.direct_ptr);
      Read<signed_char>::operator=((Read<signed_char> *)local_98,&local_a8);
      Read<signed_char>::~Read(&local_a8);
      Read<double>::~Read(local_e8);
      Read<double>::~Read(&local_c8);
      std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_b8);
    }
    else {
      pvVar6 = std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::front
                         (&p_hints->axes);
      dVar1 = (pvVar6->super_Few<double,_3>).array_[2];
      marks.write_.shared_alloc_.direct_ptr = (void *)(pvVar6->super_Few<double,_3>).array_[0];
      dVar2 = (pvVar6->super_Few<double,_3>).array_[1];
      local_f8._M_current =
           (Vector<3> *)
           std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::begin
                     (&p_hints->axes);
      __gnu_cxx::
      __normal_iterator<Omega_h::Vector<3>const*,std::vector<Omega_h::Vector<3>,std::allocator<Omega_h::Vector<3>>>>
      ::__normal_iterator<Omega_h::Vector<3>*>
                ((__normal_iterator<Omega_h::Vector<3>const*,std::vector<Omega_h::Vector<3>,std::allocator<Omega_h::Vector<3>>>>
                  *)&local_f0,&local_f8);
      local_100 = (Vector<3> *)
                  std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::erase
                            (&p_hints->axes,local_f0);
      std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_120,comm);
      Read<double>::Read(&local_130,p_coords);
      Read<double>::Read(&local_140,p_masses);
      dist.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)marks.write_.shared_alloc_.direct_ptr;
      axis_00.super_Few<double,_3>.array_[1] = dVar2;
      axis_00.super_Few<double,_3>.array_[0] = (double)marks.write_.shared_alloc_.direct_ptr;
      axis_00.super_Few<double,_3>.array_[2] = dVar1;
      mark_bisection_given_axis(&local_110,(Reals *)&local_120,&local_130,tolerance,axis_00);
      Read<signed_char>::operator=((Read<signed_char> *)local_98,(Read<signed_char> *)&local_110);
      Read<signed_char>::~Read((Read<signed_char> *)&local_110);
      Read<double>::~Read(&local_140);
      Read<double>::~Read(&local_130);
      std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_120);
    }
    std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_1f8,comm);
    Read<signed_char>::Read(&local_208,(Read<signed_char> *)local_98);
    bi_partition((Dist *)local_1e8,&local_1f8,&local_208);
    Read<signed_char>::~Read(&local_208);
    std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_1f8);
    Read<double>::Read((Read<double> *)(local_238 + 0x10),p_coords);
    Dist::exch<double>((Dist *)(local_238 + 0x20),(Read<double> *)local_1e8,(int)local_238 + 0x10);
    Read<double>::operator=(p_coords,(Read<double> *)(local_238 + 0x20));
    Read<double>::~Read((Read<double> *)(local_238 + 0x20));
    Read<double>::~Read((Read<double> *)(local_238 + 0x10));
    Read<double>::Read(&local_248,p_masses);
    Dist::exch<double>((Dist *)local_238,(Read<double> *)local_1e8,(Int)&local_248);
    Read<double>::operator=(p_masses,(Read<double> *)local_238);
    Read<double>::~Read((Read<double> *)local_238);
    Read<double>::~Read(&local_248);
    Remotes::Remotes((Remotes *)(local_2a0 + 0x18),p_owners);
    Dist::exch(&local_268,(Dist *)local_1e8,(Remotes *)(local_2a0 + 0x18),1);
    Remotes::operator=(p_owners,&local_268);
    Remotes::~Remotes(&local_268);
    Remotes::~Remotes((Remotes *)(local_2a0 + 0x18));
    peVar5 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)comm);
    IVar4 = Comm::size(peVar5);
    local_2a0._20_4_ = divide_no_remainder<int>(IVar4,2);
    peVar5 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)comm);
    peVar7 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)comm);
    IVar4 = Comm::rank(peVar7);
    key = IVar4 / (int)local_2a0._20_4_;
    peVar7 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)comm);
    Comm::rank(peVar7);
    Comm::split((Comm *)local_2a0,(I32)peVar5,key);
    std::shared_ptr<Omega_h::Comm>::operator=(comm,(shared_ptr<Omega_h::Comm> *)local_2a0);
    std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_2a0);
    std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_2b0,comm);
    recursively_bisect(&local_2b0,tolerance,p_coords,p_masses,p_owners,p_hints);
    std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_2b0);
    local_2c0._M_current =
         (Vector<3> *)
         std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::begin
                   (&p_hints->axes);
    __gnu_cxx::
    __normal_iterator<Omega_h::Vector<3>const*,std::vector<Omega_h::Vector<3>,std::allocator<Omega_h::Vector<3>>>>
    ::__normal_iterator<Omega_h::Vector<3>*>
              ((__normal_iterator<Omega_h::Vector<3>const*,std::vector<Omega_h::Vector<3>,std::allocator<Omega_h::Vector<3>>>>
                *)&local_2b8,&local_2c0);
    std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::insert
              (&p_hints->axes,local_2b8,(value_type *)&marks.write_.shared_alloc_.direct_ptr);
    Dist::~Dist((Dist *)local_1e8);
    Read<signed_char>::~Read((Read<signed_char> *)local_98);
  }
  return;
}

Assistant:

void recursively_bisect(CommPtr comm, Real tolerance, Reals* p_coords,
    Reals* p_masses, Remotes* p_owners, Rib* p_hints) {
  auto& coords = *p_coords;
  auto& masses = *p_masses;
  auto& owners = *p_owners;
  auto& hints = *p_hints;
  if (comm->size() == 1) {
    return;
  }
  Vector<3> axis;
  Read<I8> marks;
  if (hints.axes.empty()) {
    marks = inertia::mark_bisection(comm, coords, masses, tolerance, axis);
  } else {
    axis = hints.axes.front();
    hints.axes.erase(hints.axes.begin());
    marks = inertia::mark_bisection_given_axis(
        comm, coords, masses, tolerance, axis);
  }
  auto dist = bi_partition(comm, marks);
  coords = dist.exch(coords, 3);
  masses = dist.exch(masses, 1);
  owners = dist.exch(owners, 1);
  auto halfsize = divide_no_remainder(comm->size(), 2);
  comm = comm->split(comm->rank() / halfsize, comm->rank() % halfsize);
  recursively_bisect(comm, tolerance, p_coords, p_masses, p_owners, p_hints);
  hints.axes.insert(hints.axes.begin(), axis);
}